

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db_impl.cc
# Opt level: O0

Status __thiscall
leveldb::DBImpl::RecoverLogFile
          (DBImpl *this,uint64_t log_number,bool last_log,bool *save_manifest,VersionEdit *edit,
          SequenceNumber *max_sequence)

{
  bool bVar1;
  int iVar2;
  size_t sVar3;
  undefined8 uVar4;
  void *pvVar5;
  byte in_CL;
  undefined8 in_RDX;
  long in_RSI;
  LogReporter *in_RDI;
  undefined1 *in_R8;
  ulong *in_stack_00000008;
  uint64_t lfile_size;
  SequenceNumber last_seq;
  MemTable *mem;
  int compactions;
  WriteBatch batch;
  Slice record;
  string scratch;
  Reader reader;
  LogReporter reporter;
  SequentialFile *file;
  string fname;
  Status *status;
  WritableFile *in_stack_fffffffffffffde8;
  MemTable *in_stack_fffffffffffffdf0;
  string *in_stack_fffffffffffffdf8;
  Logger *info_log;
  WriteBatch *in_stack_fffffffffffffe00;
  undefined6 in_stack_fffffffffffffe08;
  undefined1 in_stack_fffffffffffffe0e;
  undefined1 in_stack_fffffffffffffe0f;
  byte bVar6;
  byte bVar7;
  MemTable *in_stack_fffffffffffffe10;
  MemTable *this_00;
  WriteBatch *in_stack_fffffffffffffe18;
  DBImpl *in_stack_fffffffffffffe20;
  undefined7 in_stack_fffffffffffffe30;
  undefined1 uVar8;
  LogReporter *bytes;
  LogReporter *this_01;
  Status local_198;
  Status local_190;
  undefined1 local_188 [16];
  ulong local_178;
  Slice local_168;
  string *in_stack_fffffffffffffea8;
  Slice *in_stack_fffffffffffffeb0;
  Reader *in_stack_fffffffffffffeb8;
  DBImpl *local_140;
  int local_134;
  Slice local_110;
  string local_100 [16];
  Version *in_stack_ffffffffffffff10;
  VersionEdit *in_stack_ffffffffffffff18;
  MemTable *in_stack_ffffffffffffff20;
  DBImpl *in_stack_ffffffffffffff28;
  MemTable *local_58;
  string local_50 [40];
  undefined1 *local_28;
  byte local_19;
  undefined8 local_18;
  
  local_19 = in_CL & 1;
  this_01 = in_RDI;
  local_28 = in_R8;
  local_18 = in_RDX;
  port::Mutex::AssertHeld((Mutex *)(in_RSI + 0x8c8));
  LogFileName(in_stack_fffffffffffffdf8,(uint64_t)in_stack_fffffffffffffdf0);
  (**(code **)(**(long **)(in_RSI + 8) + 0x10))(in_RDI,*(long **)(in_RSI + 8),local_50,&local_58);
  bVar1 = Status::ok((Status *)in_RDI);
  if (bVar1) {
    RecoverLogFile::LogReporter::LogReporter((LogReporter *)in_stack_fffffffffffffdf0);
    std::__cxx11::string::c_str();
    bytes = in_RDI;
    if ((*(byte *)(in_RSI + 0x3a) & 1) == 0) {
      bytes = (LogReporter *)0x0;
    }
    log::Reader::Reader((Reader *)in_stack_fffffffffffffe10,
                        (SequentialFile *)
                        CONCAT17(in_stack_fffffffffffffe0f,
                                 CONCAT16(in_stack_fffffffffffffe0e,in_stack_fffffffffffffe08)),
                        (Reporter *)in_stack_fffffffffffffe00,
                        SUB81((ulong)in_stack_fffffffffffffdf8 >> 0x38,0),
                        (uint64_t)in_stack_fffffffffffffdf0);
    Log(*(Logger **)(in_RSI + 0x48),"Recovering log #%llu",local_18);
    std::__cxx11::string::string(local_100);
    Slice::Slice(&local_110);
    WriteBatch::WriteBatch((WriteBatch *)in_stack_fffffffffffffdf0);
    local_134 = 0;
    local_140 = (DBImpl *)0x0;
    do {
      do {
        while( true ) {
          bVar1 = log::Reader::ReadRecord
                            (in_stack_fffffffffffffeb8,in_stack_fffffffffffffeb0,
                             in_stack_fffffffffffffea8);
          uVar8 = false;
          if (bVar1) {
            uVar8 = Status::ok((Status *)in_RDI);
          }
          if ((bool)uVar8 == false) goto LAB_0010fd99;
          sVar3 = Slice::size(&local_110);
          if (0xb < sVar3) break;
          Slice::size(&local_110);
          Slice::Slice((Slice *)in_stack_fffffffffffffdf0,(char *)in_stack_fffffffffffffde8);
          Slice::Slice(&local_168);
          Status::Corruption((Slice *)in_stack_fffffffffffffdf8,(Slice *)in_stack_fffffffffffffdf0);
          RecoverLogFile(unsigned_long,bool,bool*,leveldb::VersionEdit*,unsigned_long*)::LogReporter
          ::Corruption(unsigned_long,leveldb::Status_const__
                    (this_01,(size_t)bytes,(Status *)CONCAT17(uVar8,in_stack_fffffffffffffe30));
          Status::~Status((Status *)in_stack_fffffffffffffdf0);
        }
        WriteBatchInternal::SetContents
                  (in_stack_fffffffffffffe00,(Slice *)in_stack_fffffffffffffdf8);
        if (local_140 == (DBImpl *)0x0) {
          local_140 = (DBImpl *)operator_new(0x70);
          MemTable::MemTable(in_stack_fffffffffffffe10,
                             (InternalKeyComparator *)
                             CONCAT17(in_stack_fffffffffffffe0f,
                                      CONCAT16(in_stack_fffffffffffffe0e,in_stack_fffffffffffffe08))
                            );
          in_stack_fffffffffffffe20 = local_140;
          MemTable::Ref((MemTable *)local_140);
        }
        WriteBatchInternal::InsertInto(in_stack_fffffffffffffe18,in_stack_fffffffffffffe10);
        Status::operator=((Status *)in_stack_fffffffffffffdf0,(Status *)in_stack_fffffffffffffde8);
        Status::~Status((Status *)in_stack_fffffffffffffdf0);
        MaybeIgnoreError(in_stack_fffffffffffffe20,(Status *)in_stack_fffffffffffffe18);
        bVar1 = Status::ok((Status *)in_RDI);
        if (!bVar1) goto LAB_0010fd99;
        in_stack_fffffffffffffe18 =
             (WriteBatch *)WriteBatchInternal::Sequence((WriteBatch *)0x10fc98);
        iVar2 = WriteBatchInternal::Count((WriteBatch *)0x10fcaa);
        local_178 = (long)in_stack_fffffffffffffe18 + (long)iVar2 + -1;
        if (*in_stack_00000008 < local_178) {
          *in_stack_00000008 = local_178;
        }
        sVar3 = MemTable::ApproximateMemoryUsage((MemTable *)0x10fcf8);
      } while (sVar3 <= *(ulong *)(in_RSI + 0x50));
      local_134 = local_134 + 1;
      *local_28 = 1;
      WriteLevel0Table(in_stack_ffffffffffffff28,in_stack_ffffffffffffff20,in_stack_ffffffffffffff18
                       ,in_stack_ffffffffffffff10);
      Status::operator=((Status *)in_stack_fffffffffffffdf0,(Status *)in_stack_fffffffffffffde8);
      Status::~Status((Status *)in_stack_fffffffffffffdf0);
      MemTable::Unref(in_stack_fffffffffffffdf0);
      local_140 = (DBImpl *)0x0;
      bVar1 = Status::ok((Status *)in_RDI);
    } while (bVar1);
LAB_0010fd99:
    this_00 = local_58;
    if (local_58 != (MemTable *)0x0) {
      (*(local_58->comparator_).comparator.super_Comparator._vptr_Comparator[1])();
      this_00 = local_58;
    }
    bVar1 = Status::ok((Status *)in_RDI);
    if ((((bVar1) && ((*(byte *)(in_RSI + 0x880) & 1) != 0)) && ((local_19 & 1) != 0)) &&
       (local_134 == 0)) {
      (**(code **)(**(long **)(in_RSI + 8) + 0x58))
                (&local_190,*(long **)(in_RSI + 8),local_50,local_188);
      bVar1 = Status::ok(&local_190);
      bVar6 = 0;
      bVar7 = bVar6;
      if (bVar1) {
        (**(code **)(**(long **)(in_RSI + 8) + 0x28))
                  (&local_198,*(long **)(in_RSI + 8),local_50,in_RSI + 0x948);
        bVar6 = Status::ok(&local_198);
        bVar7 = bVar6;
        Status::~Status((Status *)in_stack_fffffffffffffdf0);
      }
      Status::~Status((Status *)in_stack_fffffffffffffdf0);
      if ((bVar6 & 1) != 0) {
        info_log = *(Logger **)(in_RSI + 0x48);
        uVar4 = std::__cxx11::string::c_str();
        Log(info_log,"Reusing old log %s \n",uVar4);
        pvVar5 = operator_new(0x20);
        log::Writer::Writer((Writer *)in_stack_fffffffffffffdf0,in_stack_fffffffffffffde8,0x10ff10);
        *(void **)(in_RSI + 0x958) = pvVar5;
        *(undefined8 *)(in_RSI + 0x950) = local_18;
        if (local_140 == (DBImpl *)0x0) {
          in_stack_fffffffffffffdf0 = (MemTable *)operator_new(0x70);
          MemTable::MemTable(this_00,(InternalKeyComparator *)
                                     CONCAT17(bVar7,CONCAT16(bVar6,in_stack_fffffffffffffe08)));
          *(MemTable **)(in_RSI + 0x930) = in_stack_fffffffffffffdf0;
          MemTable::Ref(*(MemTable **)(in_RSI + 0x930));
        }
        else {
          *(DBImpl **)(in_RSI + 0x930) = local_140;
          local_140 = (DBImpl *)0x0;
        }
      }
    }
    if (local_140 != (DBImpl *)0x0) {
      bVar1 = Status::ok((Status *)in_RDI);
      if (bVar1) {
        *local_28 = 1;
        WriteLevel0Table(in_stack_ffffffffffffff28,in_stack_ffffffffffffff20,
                         in_stack_ffffffffffffff18,in_stack_ffffffffffffff10);
        Status::operator=((Status *)in_stack_fffffffffffffdf0,(Status *)in_stack_fffffffffffffde8);
        Status::~Status((Status *)in_stack_fffffffffffffdf0);
      }
      MemTable::Unref(in_stack_fffffffffffffdf0);
    }
    WriteBatch::~WriteBatch((WriteBatch *)0x11002e);
    std::__cxx11::string::~string(local_100);
    log::Reader::~Reader((Reader *)in_stack_fffffffffffffdf0);
    RecoverLogFile::LogReporter::~LogReporter((LogReporter *)0x110055);
  }
  else {
    MaybeIgnoreError(in_stack_fffffffffffffe20,(Status *)in_stack_fffffffffffffe18);
  }
  std::__cxx11::string::~string(local_50);
  return (Status)(char *)this_01;
}

Assistant:

Status DBImpl::RecoverLogFile(uint64_t log_number, bool last_log,
                              bool* save_manifest, VersionEdit* edit,
                              SequenceNumber* max_sequence) {
  struct LogReporter : public log::Reader::Reporter {
    Env* env;
    Logger* info_log;
    const char* fname;
    Status* status;  // null if options_.paranoid_checks==false
    void Corruption(size_t bytes, const Status& s) override {
      Log(info_log, "%s%s: dropping %d bytes; %s",
          (this->status == nullptr ? "(ignoring error) " : ""), fname,
          static_cast<int>(bytes), s.ToString().c_str());
      if (this->status != nullptr && this->status->ok()) *this->status = s;
    }
  };

  mutex_.AssertHeld();

  // Open the log file
  std::string fname = LogFileName(dbname_, log_number);
  SequentialFile* file;
  Status status = env_->NewSequentialFile(fname, &file);
  if (!status.ok()) {
    MaybeIgnoreError(&status);
    return status;
  }

  // Create the log reader.
  LogReporter reporter;
  reporter.env = env_;
  reporter.info_log = options_.info_log;
  reporter.fname = fname.c_str();
  reporter.status = (options_.paranoid_checks ? &status : nullptr);
  // We intentionally make log::Reader do checksumming even if
  // paranoid_checks==false so that corruptions cause entire commits
  // to be skipped instead of propagating bad information (like overly
  // large sequence numbers).
  log::Reader reader(file, &reporter, true /*checksum*/, 0 /*initial_offset*/);
  Log(options_.info_log, "Recovering log #%llu",
      (unsigned long long)log_number);

  // Read all the records and add to a memtable
  std::string scratch;
  Slice record;
  WriteBatch batch;
  int compactions = 0;
  MemTable* mem = nullptr;
  while (reader.ReadRecord(&record, &scratch) && status.ok()) {
    if (record.size() < 12) {
      reporter.Corruption(record.size(),
                          Status::Corruption("log record too small"));
      continue;
    }
    WriteBatchInternal::SetContents(&batch, record);

    if (mem == nullptr) {
      mem = new MemTable(internal_comparator_);
      mem->Ref();
    }
    status = WriteBatchInternal::InsertInto(&batch, mem);
    MaybeIgnoreError(&status);
    if (!status.ok()) {
      break;
    }
    const SequenceNumber last_seq = WriteBatchInternal::Sequence(&batch) +
                                    WriteBatchInternal::Count(&batch) - 1;
    if (last_seq > *max_sequence) {
      *max_sequence = last_seq;
    }

    if (mem->ApproximateMemoryUsage() > options_.write_buffer_size) {
      compactions++;
      *save_manifest = true;
      status = WriteLevel0Table(mem, edit, nullptr);
      mem->Unref();
      mem = nullptr;
      if (!status.ok()) {
        // Reflect errors immediately so that conditions like full
        // file-systems cause the DB::Open() to fail.
        break;
      }
    }
  }

  delete file;

  // See if we should keep reusing the last log file.
  if (status.ok() && options_.reuse_logs && last_log && compactions == 0) {
    assert(logfile_ == nullptr);
    assert(log_ == nullptr);
    assert(mem_ == nullptr);
    uint64_t lfile_size;
    if (env_->GetFileSize(fname, &lfile_size).ok() &&
        env_->NewAppendableFile(fname, &logfile_).ok()) {
      Log(options_.info_log, "Reusing old log %s \n", fname.c_str());
      log_ = new log::Writer(logfile_, lfile_size);
      logfile_number_ = log_number;
      if (mem != nullptr) {
        mem_ = mem;
        mem = nullptr;
      } else {
        // mem can be nullptr if lognum exists but was empty.
        mem_ = new MemTable(internal_comparator_);
        mem_->Ref();
      }
    }
  }

  if (mem != nullptr) {
    // mem did not get reused; compact it.
    if (status.ok()) {
      *save_manifest = true;
      status = WriteLevel0Table(mem, edit, nullptr);
    }
    mem->Unref();
  }

  return status;
}